

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy_generic.cpp
# Opt level: O3

QList<QNetworkProxy> *
QNetworkProxyFactory::systemProxyForQuery
          (QList<QNetworkProxy> *__return_storage_ptr__,QNetworkProxyQuery *query)

{
  long lVar1;
  bool bVar2;
  Data *pDVar3;
  QNetworkProxy *pQVar4;
  QByteArray *pQVar5;
  Data *pDVar6;
  char cVar7;
  quint16 qVar8;
  CutResult CVar9;
  QueryType QVar10;
  int iVar11;
  qsizetype qVar12;
  char *pcVar13;
  longlong lVar15;
  long lVar16;
  QArrayData *pQVar17;
  long in_FS_OFFSET;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QByteArrayView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  undefined1 auVar33 [16];
  QNetworkProxy proxy;
  QUrl url;
  QArrayData *local_128;
  QString local_100;
  QString local_e8;
  QNetworkProxy local_c8;
  QUrl local_c0;
  QArrayDataPointer<QNetworkProxy> local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QString local_78;
  QString local_58;
  long local_38;
  char *pcVar14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QNetworkProxy *)0x0;
  local_b8.size = 0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_78);
  QByteArray::trimmed_helper((QByteArray *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    bVar2 = false;
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxyQuery::peerHostName(&local_78,query);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_98);
    if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
      pQVar5 = local_98.ptr;
      lVar1 = local_98.size * 0x18;
      lVar16 = 0;
      do {
        QVar18.m_data = *(char **)((long)&(pQVar5->d).ptr + lVar16);
        QVar18.m_size = *(qsizetype *)((long)&(pQVar5->d).size + lVar16);
        auVar33 = QtPrivate::trimmed(QVar18);
        pcVar14 = auVar33._8_8_;
        pcVar13 = pcVar14;
        if (auVar33._0_8_ == 0) {
LAB_002367b9:
          pQVar17 = (QArrayData *)0x0;
        }
        else if (*pcVar14 == '*') {
          local_e8.d.d = (Data *)0x1;
          local_100.d.d = (Data *)0xffffffffffffffff;
          CVar9 = QtPrivate::QContainerImplHelper::mid
                            (auVar33._0_8_,(qsizetype *)&local_e8,(qsizetype *)&local_100);
          pcVar13 = (char *)0x0;
          if (CVar9 != Null) {
            pcVar13 = pcVar14 + (long)local_e8.d.d;
          }
          auVar33._8_8_ = pcVar13;
          auVar33._0_8_ = local_100.d.d;
          pQVar17 = (QArrayData *)0x0;
          if (CVar9 != Null && &(local_100.d.d)->super_QArrayData != (QArrayData *)0x0)
          goto LAB_00236758;
        }
        else {
LAB_00236758:
          pcVar13 = auVar33._8_8_;
          pQVar17 = auVar33._0_8_;
          if (((pcVar13[(long)((long)&pQVar17[-1].alloc + 7)] == '.') &&
              (cVar7 = QString::endsWith((QChar)(char16_t)&local_78,0x2e), cVar7 == '\0')) &&
             (pQVar17 = (QArrayData *)((long)&pQVar17[-1].alloc + 7), pQVar17 == (QArrayData *)0x0))
          goto LAB_002367b9;
          if (*pcVar13 == '.') {
            local_e8.d.d = (Data *)0x1;
            local_100.d.d = (Data *)0xffffffffffffffff;
            CVar9 = QtPrivate::QContainerImplHelper::mid
                              ((qsizetype)pQVar17,(qsizetype *)&local_e8,(qsizetype *)&local_100);
            if (CVar9 == Null) {
              pQVar17 = (QArrayData *)0x0;
              pcVar13 = (char *)0x0;
            }
            else {
              pcVar13 = pcVar13 + (long)local_e8.d.d;
              pQVar17 = &(local_100.d.d)->super_QArrayData;
            }
          }
        }
        QVar19.m_data = (char *)pQVar17;
        QVar19.m_size = (qsizetype)&local_78;
        cVar7 = QString::endsWith(QVar19,(CaseSensitivity)pcVar13);
        if ((cVar7 != '\0') &&
           ((bVar2 = true, (QArrayData *)local_78.d.size == pQVar17 ||
            (local_78.d.ptr
             [(long)((long)&(((QBasicAtomicInt *)local_78.d.size)->_q_value).
                            super___atomic_base<int>._M_i + ~(ulong)pQVar17)] == L'.'))))
        goto LAB_00236818;
        lVar16 = lVar16 + 0x18;
      } while (lVar1 != lVar16);
    }
    bVar2 = false;
LAB_00236818:
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar2) {
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (storage_type_conflict *)0x0;
    local_78.d.size = 0;
    local_78.d._0_16_ = ZEXT816(0);
    local_98.size = 0;
    local_98._0_16_ = ZEXT816(0);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)&local_e8,NoProxy,&local_58,0,&local_78,(QString *)&local_98);
    QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy>
              ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,(QNetworkProxy *)&local_e8
              );
    QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
    (__return_storage_ptr__->d).d = local_b8.d;
    (__return_storage_ptr__->d).ptr = local_b8.ptr;
    (__return_storage_ptr__->d).size = local_b8.size;
    if (local_b8.d != (Data *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_e8);
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00237122;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_00237122;
    lVar15 = 2;
    local_128 = &(local_78.d.d)->super_QArrayData;
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxyQuery::protocolTag(&local_58,query);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x3) {
      QVar22.m_data = local_58.d.ptr;
      QVar22.m_size = 3;
      QVar29.m_data = "ftp";
      QVar29.m_size = 3;
      QtPrivate::equalStrings(QVar22,QVar29);
    }
    else if ((undefined1 *)local_58.d.size == (undefined1 *)0x5) {
      QVar21.m_data = local_58.d.ptr;
      QVar21.m_size = 5;
      QVar28.m_data = "https";
      QVar28.m_size = 5;
      QtPrivate::equalStrings(QVar21,QVar28);
    }
    else if ((undefined1 *)local_58.d.size == (undefined1 *)0x4) {
      QVar20.m_data = local_58.d.ptr;
      QVar20.m_size = 4;
      QVar27.m_data = "http";
      QVar27.m_size = 4;
      QtPrivate::equalStrings(QVar20,QVar27);
    }
    qgetenv((char *)&local_78);
    auVar33 = (undefined1  [16])local_78.d._0_16_;
    pDVar6 = local_78.d.d;
    if ((QArrayData *)local_78.d.size == (QArrayData *)0x0) {
      qgetenv((char *)&local_78);
      pQVar17 = (QArrayData *)local_78.d.size;
      local_128 = &(local_78.d.d)->super_QArrayData;
      local_78.d.size = 0;
      local_78.d._0_16_ = auVar33;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,1,0x10);
        }
      }
      if (pQVar17 != (QArrayData *)0x0) goto LAB_00236af4;
    }
    else {
      local_128 = &(local_78.d.d)->super_QArrayData;
      pQVar17 = (QArrayData *)local_78.d.size;
LAB_00236af4:
      local_c0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QVar23.m_data = (storage_type *)pQVar17;
      QVar23.m_size = (qsizetype)&local_78;
      QString::fromLocal8Bit(QVar23);
      QUrl::QUrl(&local_c0,(QString *)&local_78,TolerantMode);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::scheme();
      switch(local_78.d.size) {
      case 0:
switchD_00236b86_caseD_0:
        QVar10 = QNetworkProxyQuery::queryType(query);
        if ((QVar10 != UdpSocket) &&
           (QVar10 = QNetworkProxyQuery::queryType(query), QVar10 != TcpServer)) {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar8 = 0x1f90;
          }
          else {
            qVar8 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,HttpProxy,(QString *)&local_98,qVar8,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QList<QNetworkProxy>::operator<<((QList<QNetworkProxy> *)&local_b8,&local_c8);
LAB_00236fac:
          QNetworkProxy::~QNetworkProxy(&local_c8);
        }
        break;
      case 4:
        QVar24.m_data = local_78.d.ptr;
        QVar24.m_size = 4;
        QVar30.m_data = "http";
        QVar30.m_size = 4;
        cVar7 = QtPrivate::equalStrings(QVar24,QVar30);
        if (cVar7 != '\0') goto switchD_00236b86_caseD_0;
        break;
      case 6:
        QVar25.m_data = local_78.d.ptr;
        QVar25.m_size = 6;
        QVar31.m_data = "socks5";
        QVar31.m_size = 6;
        cVar7 = QtPrivate::equalStrings(QVar25,QVar31);
        if (cVar7 != '\0') {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar8 = 0x438;
          }
          else {
            qVar8 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,Socks5Proxy,(QString *)&local_98,qVar8,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                    ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,&local_c8);
          QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
          goto LAB_00236fac;
        }
        break;
      case 7:
        QVar26.m_data = local_78.d.ptr;
        QVar26.m_size = 7;
        QVar32.m_data = "socks5h";
        QVar32.m_size = 7;
        cVar7 = QtPrivate::equalStrings(QVar26,QVar32);
        if (cVar7 != '\0') {
          local_c8.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QUrl::host(&local_98,&local_c0,0x7f00000);
          iVar11 = QUrl::port((int)&local_c0);
          if (iVar11 == 0) {
            qVar8 = 0x438;
          }
          else {
            qVar8 = QUrl::port((int)&local_c0);
          }
          QUrl::userName(&local_e8,&local_c0,0x7f00000);
          QUrl::password(&local_100,&local_c0,0x7f00000);
          QNetworkProxy::QNetworkProxy
                    (&local_c8,Socks5Proxy,(QString *)&local_98,qVar8,&local_e8,&local_100);
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
              (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
            LOCK();
            *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
            UNLOCK();
            if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          QNetworkProxy::setCapabilities(&local_c8,(Capabilities)0x10);
          QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                    ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,&local_c8);
          QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
          goto LAB_00236fac;
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      QUrl::~QUrl(&local_c0);
    }
    qVar12 = local_b8.size;
    if (local_b8.size == 0) {
      local_78.d.size = 0;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QByteArray *)0x0;
      local_e8.d.size = 0;
      local_e8.d.d = (Data *)0x0;
      local_e8.d.ptr = (char16_t *)0x0;
      QNetworkProxy::QNetworkProxy
                ((QNetworkProxy *)&local_100,NoProxy,&local_78,0,(QString *)&local_98,&local_e8);
      QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy>
                ((QMovableArrayOps<QNetworkProxy> *)&local_b8,local_b8.size,
                 (QNetworkProxy *)&local_100);
      QList<QNetworkProxy>::end((QList<QNetworkProxy> *)&local_b8);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_100);
      if ((totally_ordered_wrapper<QNetworkProxyPrivate_*>)local_e8.d.d !=
          (totally_ordered_wrapper<QNetworkProxyPrivate_*>)0x0) {
        LOCK();
        *(int *)local_e8.d.d = (int)*(Type *)local_e8.d.d + -1;
        UNLOCK();
        if ((__atomic_base<int>)*(__int_type *)local_e8.d.d == (__atomic_base<int>)0x0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
        }
      }
      qVar12 = local_b8.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          qVar12 = local_b8.size;
        }
      }
    }
    pQVar4 = local_b8.ptr;
    pDVar3 = local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QNetworkProxy *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pQVar4;
    local_b8.size = 0;
    (__return_storage_ptr__->d).size = qVar12;
    if (local_128 == (QArrayData *)0x0) goto LAB_00237122;
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_00237122;
    lVar15 = 1;
  }
  QArrayData::deallocate(local_128,lVar15,0x10);
LAB_00237122:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkProxy> QNetworkProxyFactory::systemProxyForQuery(const QNetworkProxyQuery &query)
{
    QList<QNetworkProxy> proxyList;

    if (ignoreProxyFor(query))
        return proxyList << QNetworkProxy::NoProxy;

    // No need to care about casing here, QUrl lowercases values already
    const QString queryProtocol = query.protocolTag();
    QByteArray proxy_env;

    if (queryProtocol == "http"_L1)
        proxy_env = qgetenv("http_proxy");
    else if (queryProtocol == "https"_L1)
        proxy_env = qgetenv("https_proxy");
    else if (queryProtocol == "ftp"_L1)
        proxy_env = qgetenv("ftp_proxy");
    else
        proxy_env = qgetenv("all_proxy");

    // Fallback to http_proxy is no protocol specific proxy was found
    if (proxy_env.isEmpty())
        proxy_env = qgetenv("http_proxy");

    if (!proxy_env.isEmpty()) {
        QUrl url = QUrl(QString::fromLocal8Bit(proxy_env));
        const QString scheme = url.scheme();
        if (scheme == "socks5"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxyList << proxy;
        } else if (scheme == "socks5h"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxy.setCapabilities(QNetworkProxy::HostNameLookupCapability);
            proxyList << proxy;
        } else if ((scheme.isEmpty() || scheme == "http"_L1)
                  && query.queryType() != QNetworkProxyQuery::UdpSocket
                  && query.queryType() != QNetworkProxyQuery::TcpServer) {
            QNetworkProxy proxy(QNetworkProxy::HttpProxy, url.host(),
                    url.port() ? url.port() : 8080, url.userName(), url.password());
            proxyList << proxy;
        }
    }
    if (proxyList.isEmpty())
        proxyList << QNetworkProxy::NoProxy;

    return proxyList;
}